

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O3

bool __thiscall
QScrollerPrivate::releaseWhileDragging(QScrollerPrivate *this,QPointF *position,qint64 timestamp)

{
  QScrollerPropertiesPrivate *pQVar1;
  QScroller *this_00;
  ulong uVar2;
  double dVar3;
  undefined1 auVar4 [16];
  QDebug this_01;
  qreal qVar5;
  bool bVar6;
  bool bVar7;
  State newstate;
  long in_FS_OFFSET;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QPointF QVar18;
  QPointF local_a8;
  undefined4 uStack_98;
  undefined4 local_94;
  char *local_90;
  QDebug local_80;
  QPointF local_78;
  QPointF local_68;
  QPointF local_58;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->properties).d.d;
  this_00 = this->q_ptr;
  handleDrag(this,position,timestamp);
  dVar11 = position->xp;
  dVar14 = position->yp;
  dVar12 = (this->pressPosition).xp;
  dVar3 = (this->pressPosition).yp;
  QVar18 = QScroller::pixelPerMeter(this_00);
  auVar4._8_8_ = dVar14 - dVar3;
  auVar4._0_8_ = dVar11 - dVar12;
  auVar13 = divpd(auVar4,(undefined1  [16])QVar18);
  dVar11 = auVar13._0_8_;
  dVar14 = auVar13._8_8_;
  uVar8 = -(ulong)(dVar11 < -dVar11);
  uVar9 = -(ulong)(dVar14 < -dVar14);
  uVar2 = (ulong)-dVar14 & uVar9;
  auVar10._0_8_ = ~uVar8 & (ulong)dVar11;
  auVar10._8_8_ = ~uVar9 & (ulong)dVar14;
  auVar13._8_4_ = (int)uVar2;
  auVar13._0_8_ = (ulong)-dVar11 & uVar8;
  auVar13._12_4_ = (int)(uVar2 >> 0x20);
  dVar11 = SUB168(auVar10 | auVar13,8) + SUB168(auVar10 | auVar13,0);
  if (pQVar1->dragStartDistance <= dVar11 && dVar11 != pQVar1->dragStartDistance) {
    local_a8.xp._0_4_ = 0;
    local_a8.xp._4_4_ = 0;
    local_a8.yp._0_4_ = 0;
    local_a8.yp._4_4_ = 0;
    bVar6 = qFuzzyCompare(&this->oldVelocity,&local_a8);
    if (!bVar6) {
      dVar11 = pQVar1->acceleratingFlickMaximumTime;
      if (((dVar11 != 0.0) || (NAN(dVar11))) &&
         (timestamp - this->pressTimestamp < (long)(dVar11 * 1000.0))) {
        dVar11 = (this->releaseVelocity).xp;
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          bVar6 = 0.0 < dVar11 != (this->oldVelocity).xp <= 0.0;
        }
        else {
          bVar6 = false;
        }
        dVar11 = (this->releaseVelocity).yp;
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          bVar7 = (this->oldVelocity).yp <= 0.0 != 0.0 < dVar11;
        }
        else {
          bVar7 = false;
        }
        if (bVar6) {
          dVar11 = pQVar1->maximumVelocity;
          dVar12 = (this->oldVelocity).xp * pQVar1->acceleratingFlickSpeedupFactor;
          dVar14 = dVar11;
          if (dVar12 <= dVar11) {
            dVar14 = dVar12;
          }
          if (dVar14 <= -dVar11) {
            dVar14 = -dVar11;
          }
          (this->releaseVelocity).xp = dVar14;
        }
        if (bVar7) {
          dVar11 = pQVar1->maximumVelocity;
          dVar12 = (this->oldVelocity).yp * pQVar1->acceleratingFlickSpeedupFactor;
          dVar14 = dVar11;
          if (dVar12 <= dVar11) {
            dVar14 = dVar12;
          }
          if (dVar14 <= -dVar11) {
            dVar14 = -dVar11;
          }
          (this->releaseVelocity).yp = dVar14;
        }
      }
    }
  }
  QVar18 = QScroller::pixelPerMeter(this_00);
  local_58.yp = QVar18.yp;
  local_58.xp = QVar18.xp;
  local_a8.xp = (this->overshootPosition).xp + (this->contentPosition).xp;
  local_a8.yp = (this->overshootPosition).yp + (this->contentPosition).yp;
  createScrollingSegments(this,&this->releaseVelocity,&local_a8,&local_58);
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_a8.xp._0_4_ = 2;
    local_a8.xp._4_4_ = 0;
    local_a8.yp._0_4_ = 0;
    local_a8.yp._4_4_ = 0;
    uStack_98 = 0;
    local_94 = 0;
    local_90 = lcScroller::category.name;
    QMessageLogger::debug();
    this_01.stream = local_80.stream;
    QVar15.m_data = (storage_type *)0x2e;
    QVar15.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<((QTextStream *)this_01.stream,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
    }
    *(int *)((QTextStream *)local_80.stream + 0x28) =
         *(int *)((QTextStream *)local_80.stream + 0x28) + 1;
    ::operator<<((QDebug)&local_78.yp,&local_78);
    qVar5 = local_78.yp;
    QVar16.m_data = (storage_type *)0x14;
    QVar16.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar16);
    QTextStream::operator<<((QTextStream *)qVar5,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_78.yp + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_78.yp,' ');
    }
    QTextStream::operator<<((QTextStream *)local_78.yp,pQVar1->minimumVelocity);
    if (*(QTextStream *)((long)local_78.yp + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_78.yp,' ');
    }
    qVar5 = local_78.yp;
    QVar17.m_data = (storage_type *)0x9;
    QVar17.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar17);
    QTextStream::operator<<((QTextStream *)qVar5,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_78.yp + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_78.yp,' ');
    }
    *(int *)((long)local_78.yp + 0x28) = *(int *)((long)local_78.yp + 0x28) + 1;
    ::operator<<((QDebug)&local_68.yp,&local_68);
    QDebug::~QDebug((QDebug *)&local_68.yp);
    QDebug::~QDebug((QDebug *)&local_68);
    QDebug::~QDebug((QDebug *)&local_78.yp);
    QDebug::~QDebug((QDebug *)&local_78);
    QDebug::~QDebug(&local_80);
  }
  if (((this->xSegments).super_QList<QScrollerPrivate::ScrollSegment>.d.size == 0) &&
     ((this->ySegments).super_QList<QScrollerPrivate::ScrollSegment>.d.size == 0)) {
    newstate = Inactive;
  }
  else {
    newstate = Scrolling;
  }
  setState(this,newstate);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QScrollerPrivate::releaseWhileDragging(const QPointF &position, qint64 timestamp)
{
    Q_Q(QScroller);
    const QScrollerPropertiesPrivate *sp = properties.d.data();

    // handleDrag updates lastPosition, lastTimestamp and velocity
    handleDrag(position, timestamp);

    // check if we moved at all - this can happen if you stop a running
    // scroller with a press and release shortly afterwards
    QPointF deltaPixel = position - pressPosition;
    if (((deltaPixel / q->pixelPerMeter()).manhattanLength()) > sp->dragStartDistance) {

        // handle accelerating flicks
        if ((oldVelocity != QPointF(0, 0)) && sp->acceleratingFlickMaximumTime &&
            ((timestamp - pressTimestamp) < qint64(sp->acceleratingFlickMaximumTime * 1000))) {

            // - determine if the direction was changed
            int signX = 0, signY = 0;
            if (releaseVelocity.x())
                signX = (releaseVelocity.x() > 0) == (oldVelocity.x() > 0) ? 1 : -1;
            if (releaseVelocity.y())
                signY = (releaseVelocity.y() > 0) == (oldVelocity.y() > 0) ? 1 : -1;

            if (signX > 0)
                releaseVelocity.setX(qBound(-sp->maximumVelocity,
                                            oldVelocity.x() * sp->acceleratingFlickSpeedupFactor,
                                            sp->maximumVelocity));
            if (signY > 0)
                releaseVelocity.setY(qBound(-sp->maximumVelocity,
                                            oldVelocity.y() * sp->acceleratingFlickSpeedupFactor,
                                            sp->maximumVelocity));
        }
    }

    QPointF ppm = q->pixelPerMeter();
    createScrollingSegments(releaseVelocity, contentPosition + overshootPosition, ppm);

    qCDebug(lcScroller) << "QScroller::releaseWhileDragging() -- velocity:" << releaseVelocity
                        << "-- minimum velocity:" << sp->minimumVelocity << "overshoot" << overshootPosition;

    if (xSegments.isEmpty() && ySegments.isEmpty())
        setState(QScroller::Inactive);
    else
        setState(QScroller::Scrolling);

    return true;
}